

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightHandle
pbrt::LightHandle::Create
          (string *name,ParameterDictionary *parameters,Transform *renderFromLight,
          CameraTransform *cameraTransform,MediumHandle *outsideMedium,FileLoc *loc,Allocator alloc)

{
  float fVar1;
  undefined1 auVar2 [16];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  bool bVar3;
  ulong uVar4;
  Point2i PVar5;
  reference pPVar6;
  ParameterDictionary *in_RDX;
  int __x;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  in_RDI;
  Tuple2<pbrt::Point2,_int> this;
  Float FVar7;
  double dVar8;
  double dVar9;
  undefined8 uVar11;
  undefined1 auVar10 [64];
  undefined1 auVar12 [56];
  RGB RVar13;
  Point3f PVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  ColorEncodingHandle *in_stack_000000e8;
  string *in_stack_000000f0;
  Allocator in_stack_000000f8;
  FileLoc *in_stack_000001c8;
  RGBColorSpace *in_stack_000001d0;
  ParameterDictionary *in_stack_000001d8;
  MediumHandle *in_stack_000001e0;
  Transform *in_stack_000001e8;
  Allocator in_stack_000001f0;
  Point3f *p;
  iterator __end10;
  iterator __begin10;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *__range10;
  Image image;
  Float k_e_2;
  int c;
  ImageChannelValues values;
  int x;
  float sinTheta;
  float cosTheta;
  float theta;
  float v;
  int y;
  RGB lum;
  int xe;
  int xs;
  int ys;
  int ye;
  Image *image_1;
  float illuminance;
  ImageChannelDesc channelDesc;
  RGBColorSpace *colorSpace_1;
  ImageAndMetadata imageAndMetadata;
  Float k_e_1;
  Float k_e;
  Float E_v;
  string filename;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> portal;
  Float scale;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> L;
  RGBColorSpace *colorSpace;
  LightHandle *light;
  ProjectionLight *in_stack_fffffffffffff648;
  PortalImageInfiniteLight *pPVar15;
  ImageInfiniteLight *pIVar16;
  ImageAndMetadata *in_stack_fffffffffffff650;
  undefined4 in_stack_fffffffffffff658;
  WrapMode in_stack_fffffffffffff65c;
  ImageInfiniteLight *in_stack_fffffffffffff660;
  Transform *in_stack_fffffffffffff668;
  undefined4 in_stack_fffffffffffff670;
  float in_stack_fffffffffffff674;
  undefined1 in_stack_fffffffffffff678 [16];
  undefined4 in_stack_fffffffffffff688;
  float in_stack_fffffffffffff68c;
  uint in_stack_fffffffffffff690;
  float in_stack_fffffffffffff694;
  undefined4 in_stack_fffffffffffff698;
  undefined4 in_stack_fffffffffffff69c;
  value_type_conflict1 vVar17;
  RGBColorSpace *in_stack_fffffffffffff6a0;
  Allocator in_stack_fffffffffffff6a8;
  string *in_stack_fffffffffffff6e8;
  Image *in_stack_fffffffffffff728;
  undefined7 in_stack_fffffffffffff730;
  undefined1 in_stack_fffffffffffff737;
  size_t in_stack_fffffffffffff738;
  Tuple2<pbrt::Point2,_int> wrapMode;
  Tuple2<pbrt::Point2,_int> p_00;
  Image *pIVar18;
  Allocator AVar19;
  ParameterDictionary *in_stack_fffffffffffff820;
  __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
  local_748;
  undefined1 *local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_738;
  FileLoc *in_stack_fffffffffffff8d8;
  RGBColorSpace *in_stack_fffffffffffff8e0;
  ParameterDictionary *in_stack_fffffffffffff8e8;
  MediumHandle *in_stack_fffffffffffff8f0;
  Transform *in_stack_fffffffffffff8f8;
  Allocator in_stack_fffffffffffff900;
  FileLoc *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9ec;
  int c_00;
  ParameterDictionary *in_stack_fffffffffffff9f0;
  Transform *in_stack_fffffffffffff9f8;
  Allocator in_stack_fffffffffffffa00;
  int local_5d0;
  int iStack_5bc;
  int local_5b4;
  RGB local_59c;
  Tuple2<pbrt::Point2,_int> local_590;
  int local_588;
  int local_584;
  int local_580;
  Tuple2<pbrt::Point2,_int> local_57c;
  int local_574;
  Image *local_570;
  float local_564;
  undefined1 local_554;
  undefined1 local_553 [11];
  undefined1 local_548 [32];
  undefined1 local_528 [64];
  anon_union_128_1_a7e8d694_for_InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_5
  local_4e8;
  FileLoc *in_stack_fffffffffffffc08;
  RGBColorSpace *in_stack_fffffffffffffc10;
  ParameterDictionary *in_stack_fffffffffffffc18;
  MediumHandle *in_stack_fffffffffffffc20;
  Transform *in_stack_fffffffffffffc28;
  Allocator in_stack_fffffffffffffc30;
  FileLoc *in_stack_fffffffffffffd80;
  ParameterDictionary *in_stack_fffffffffffffd88;
  MediumHandle *in_stack_fffffffffffffd90;
  Transform *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  allocator<char> local_229;
  string local_228 [32];
  Float local_208;
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [32];
  undefined1 local_150 [32];
  string local_130 [36];
  Float local_10c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  allocator<char> local_e9;
  string local_e8 [32];
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> local_c8;
  RGBColorSpace *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined8 local_68;
  undefined8 local_50;
  undefined8 local_20;
  undefined8 local_10;
  RGB *this_00;
  
  local_10 = in_stack_00000010;
  local_20 = in_RDX;
  TaggedPointer((LightHandle *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff650,(char *)in_stack_fffffffffffff648);
  pIVar18 = in_stack_fffffffffffff678._8_8_;
  if (bVar3) {
    MediumHandle::MediumHandle
              ((MediumHandle *)in_stack_fffffffffffff650,(MediumHandle *)in_stack_fffffffffffff648);
    ParameterDictionary::ColorSpace((ParameterDictionary *)local_20);
    local_50 = local_10;
    PointLight::Create(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8
                       ,in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff900);
    TaggedPointer<pbrt::PointLight>
              ((LightHandle *)in_stack_fffffffffffff650,(PointLight *)in_stack_fffffffffffff648);
    operator=((LightHandle *)in_stack_fffffffffffff650,(LightHandle *)in_stack_fffffffffffff648);
    goto LAB_0070278c;
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff650,(char *)in_stack_fffffffffffff648);
  pIVar18 = in_stack_fffffffffffff678._8_8_;
  if (bVar3) {
    MediumHandle::MediumHandle
              ((MediumHandle *)in_stack_fffffffffffff650,(MediumHandle *)in_stack_fffffffffffff648);
    ParameterDictionary::ColorSpace((ParameterDictionary *)local_20);
    local_68 = local_10;
    SpotLight::Create(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                      in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc30)
    ;
    TaggedPointer<pbrt::SpotLight>
              ((LightHandle *)in_stack_fffffffffffff650,(SpotLight *)in_stack_fffffffffffff648);
    operator=((LightHandle *)in_stack_fffffffffffff650,(LightHandle *)in_stack_fffffffffffff648);
    goto LAB_0070278c;
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff650,(char *)in_stack_fffffffffffff648);
  pIVar18 = in_stack_fffffffffffff678._8_8_;
  if (bVar3) {
    MediumHandle::MediumHandle
              ((MediumHandle *)in_stack_fffffffffffff650,(MediumHandle *)in_stack_fffffffffffff648);
    ParameterDictionary::ColorSpace((ParameterDictionary *)local_20);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10;
    GoniometricLight::Create
              (in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,
               in_stack_000001c8,in_stack_000001f0);
    TaggedPointer<pbrt::GoniometricLight>
              ((LightHandle *)in_stack_fffffffffffff650,
               (GoniometricLight *)in_stack_fffffffffffff648);
    operator=((LightHandle *)in_stack_fffffffffffff650,(LightHandle *)in_stack_fffffffffffff648);
    goto LAB_0070278c;
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff650,(char *)in_stack_fffffffffffff648);
  pIVar18 = in_stack_fffffffffffff678._8_8_;
  if (bVar3) {
    MediumHandle::MediumHandle
              ((MediumHandle *)in_stack_fffffffffffff650,(MediumHandle *)in_stack_fffffffffffff648);
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10;
    AVar19.memoryResource._4_4_ = in_stack_fffffffffffffda4;
    AVar19.memoryResource._0_4_ = in_stack_fffffffffffffda0;
    ProjectionLight::Create
              (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               in_stack_fffffffffffffd80,AVar19);
    TaggedPointer<pbrt::ProjectionLight>
              ((LightHandle *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
    operator=((LightHandle *)in_stack_fffffffffffff650,(LightHandle *)in_stack_fffffffffffff648);
    goto LAB_0070278c;
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff650,(char *)in_stack_fffffffffffff648);
  pIVar18 = in_stack_fffffffffffff678._8_8_;
  if (bVar3) {
    ParameterDictionary::ColorSpace((ParameterDictionary *)local_20);
    local_a8._M_allocated_capacity = local_10;
    DistantLight::Create
              (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
               (RGBColorSpace *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               in_stack_fffffffffffff9e0,in_stack_fffffffffffffa00);
    TaggedPointer<pbrt::DistantLight>
              ((LightHandle *)in_stack_fffffffffffff650,(DistantLight *)in_stack_fffffffffffff648);
    operator=((LightHandle *)in_stack_fffffffffffff650,(LightHandle *)in_stack_fffffffffffff648);
    in_stack_fffffffffffff820 = (ParameterDictionary *)local_20;
    goto LAB_0070278c;
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff650,(char *)in_stack_fffffffffffff648);
  if (!bVar3) {
    ErrorExit<std::__cxx11::string_const&>
              ((FileLoc *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
               in_stack_fffffffffffff678._8_8_);
  }
  local_b0 = ParameterDictionary::ColorSpace((ParameterDictionary *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
             (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             in_stack_fffffffffffff678._8_8_);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10;
  ParameterDictionary::GetSpectrumArray
            ((ParameterDictionary *)in_stack_fffffffffffff6a0,
             (string *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698),
             (SpectrumType)in_stack_fffffffffffff694,in_stack_fffffffffffff6a8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
             (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             in_stack_fffffffffffff678._8_8_);
  FVar7 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)in_stack_fffffffffffff650,
                     (string *)in_stack_fffffffffffff648,0.0);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x1f));
  local_10c = FVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
             (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             in_stack_fffffffffffff678._8_8_);
  ParameterDictionary::GetPoint3fArray
            ((ParameterDictionary *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
             (string *)in_stack_fffffffffffff650);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
             (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             in_stack_fffffffffffff678._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
             (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             in_stack_fffffffffffff678._8_8_);
  ParameterDictionary::GetOneString
            ((ParameterDictionary *)in_stack_fffffffffffff6a8.memoryResource,
             (string *)in_stack_fffffffffffff6a0,
             (string *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
  ResolveFilename(in_stack_fffffffffffff6e8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
             (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             in_stack_fffffffffffff678._8_8_);
  FVar7 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)in_stack_fffffffffffff650,
                     (string *)in_stack_fffffffffffff648,0.0);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  local_208 = FVar7;
  bVar3 = std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::empty
                    ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)
                     in_stack_fffffffffffff660);
  if (bVar3) {
    uVar4 = std::__cxx11::string::empty();
    pIVar18 = in_stack_fffffffffffff678._8_8_;
    if ((uVar4 & 1) == 0) goto LAB_00701a0e;
    SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
              ((SpectrumHandle *)in_stack_fffffffffffff650,
               (DenselySampledSpectrum *)in_stack_fffffffffffff648);
    FVar7 = SpectrumToPhotometric((SpectrumHandle *)in_stack_fffffffffffff660);
    local_10c = local_10c / FVar7;
    if (0.0 < local_208) {
      local_10c = (local_208 / 3.1415927) * local_10c;
    }
    pstd::pmr::polymorphic_allocator<std::byte>::
    new_object<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::DenselySampledSpectrum_const*,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
              ((polymorphic_allocator<std::byte> *)
               CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
               in_stack_fffffffffffff668,(DenselySampledSpectrum **)in_stack_fffffffffffff660,
               (float *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
               (polymorphic_allocator<std::byte> *)in_stack_fffffffffffff650);
    TaggedPointer<pbrt::UniformInfiniteLight>
              ((LightHandle *)in_stack_fffffffffffff650,
               (UniformInfiniteLight *)in_stack_fffffffffffff648);
    operator=((LightHandle *)in_stack_fffffffffffff650,(LightHandle *)in_stack_fffffffffffff648);
  }
  else {
LAB_00701a0e:
    bVar3 = std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::empty
                      ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)
                       in_stack_fffffffffffff660);
    pIVar18 = in_stack_fffffffffffff678._8_8_;
    if (bVar3) {
      local_4e8._96_8_ = local_10;
      ColorEncodingHandle::TaggedPointer
                ((ColorEncodingHandle *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      Image::Read(in_stack_000000f0,in_stack_000000f8,in_stack_000000e8);
      local_4e8._80_8_ = ImageMetadata::GetColorSpace((ImageMetadata *)in_stack_fffffffffffff648);
      local_554 = 1;
      local_553._3_8_ = local_548;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                 (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                 in_stack_fffffffffffff678._8_8_);
      local_553._3_8_ = local_528;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                 (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                 in_stack_fffffffffffff678._8_8_);
      pIVar18 = (Image *)(local_528 + 0x20);
      AVar19.memoryResource = (memory_resource *)local_553;
      local_553._3_8_ = pIVar18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                 (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                 in_stack_fffffffffffff678._8_8_);
      local_554 = 0;
      local_4e8._0_8_ = local_548;
      local_4e8.fixed[0]._M_string_length = 3;
      v_00._M_array._4_4_ = in_stack_fffffffffffff65c;
      v_00._M_array._0_4_ = in_stack_fffffffffffff658;
      v_00._M_len = (size_type)in_stack_fffffffffffff660;
      pstd::
      span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_stack_fffffffffffff650,v_00);
      requestedChannels.ptr._7_1_ = in_stack_fffffffffffff737;
      requestedChannels.ptr._0_7_ = in_stack_fffffffffffff730;
      requestedChannels.n = in_stack_fffffffffffff738;
      Image::GetChannelDesc(in_stack_fffffffffffff728,requestedChannels);
      wrapMode = (Tuple2<pbrt::Point2,_int>)local_548;
      this = (Tuple2<pbrt::Point2,_int>)&local_4e8;
      do {
        this = (Tuple2<pbrt::Point2,_int>)((long)this + -0x20);
        std::__cxx11::string::~string((string *)this);
      } while (this != wrapMode);
      p_00 = this;
      std::allocator<char>::~allocator((allocator<char> *)local_553);
      std::allocator<char>::~allocator((allocator<char> *)(local_553 + 1));
      std::allocator<char>::~allocator((allocator<char> *)(local_553 + 2));
      bVar3 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x701dee);
      if (!bVar3) {
        ErrorExit<std::__cxx11::string&>
                  ((FileLoc *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                   (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                   in_stack_fffffffffffff678._8_8_);
      }
      SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
                ((SpectrumHandle *)in_stack_fffffffffffff650,
                 (DenselySampledSpectrum *)in_stack_fffffffffffff648);
      FVar7 = SpectrumToPhotometric((SpectrumHandle *)in_stack_fffffffffffff660);
      local_10c = local_10c / FVar7;
      uVar11 = 0;
      if (0.0 < local_208) {
        local_564 = 0.0;
        local_570 = (Image *)&local_4e8.fixed[3]._M_string_length;
        local_57c = (Tuple2<pbrt::Point2,_int>)Image::Resolution(local_570);
        local_574 = local_57c.y / 2;
        local_580 = 0;
        local_584 = 0;
        local_590 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(local_570);
        local_588 = local_590.x;
        ImageMetadata::GetColorSpace((ImageMetadata *)in_stack_fffffffffffff648);
        RVar13 = RGBColorSpace::LuminanceVector(in_stack_fffffffffffff6a0);
        local_59c.b = RVar13.b;
        auVar2._8_8_ = uVar11;
        auVar2._0_8_ = RVar13._0_8_;
        local_59c._0_8_ = vmovlpd_avx(auVar2);
        for (local_5b4 = local_580; local_5b4 < local_574; local_5b4 = local_5b4 + 1) {
          PVar5 = Image::Resolution(local_570);
          iStack_5bc = PVar5.super_Tuple2<pbrt::Point2,_int>.y;
          fVar1 = (((float)local_5b4 + 0.5) / (float)iStack_5bc + -0.5) * 3.1415927;
          dVar8 = std::cos((double)(ulong)(uint)fVar1);
          dVar9 = std::sin((double)(ulong)(uint)fVar1);
          for (local_5d0 = local_584; local_5d0 < local_588; local_5d0 = local_5d0 + 1) {
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff650,
                                (int)((ulong)in_stack_fffffffffffff648 >> 0x20),
                                (int)in_stack_fffffffffffff648);
            WrapMode2D::WrapMode2D
                      ((WrapMode2D *)in_stack_fffffffffffff660,in_stack_fffffffffffff65c);
            Image::GetChannels((Image *)this,(Point2i)p_00,(WrapMode2D)wrapMode);
            for (c_00 = 0; c_00 < 3; c_00 = c_00 + 1) {
              in_stack_fffffffffffff6a8.memoryResource =
                   (memory_resource *)
                   InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                             ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                              in_stack_fffffffffffff650,(size_type)in_stack_fffffffffffff648);
              vVar17 = *(value_type_conflict1 *)
                        &(((ParameterDictionary *)in_stack_fffffffffffff6a8.memoryResource)->params)
                         .alloc.memoryResource;
              this_00 = &local_59c;
              in_stack_fffffffffffff6a0 = (RGBColorSpace *)RGB::operator[](this_00,c_00);
              __x = (int)this_00;
              in_stack_fffffffffffff694 =
                   vVar17 * *(float *)&(((ParsedParameterVector *)&in_stack_fffffffffffff6a0->r)->
                                       alloc).memoryResource;
              in_stack_fffffffffffff68c = SUB84(dVar8,0);
              std::abs(__x);
              in_stack_fffffffffffff68c = in_stack_fffffffffffff694 * in_stack_fffffffffffff68c;
              in_stack_fffffffffffff690 = SUB84(dVar9,0);
              std::abs(__x);
              auVar2 = vfmadd213ss_fma(ZEXT416(in_stack_fffffffffffff690),
                                       ZEXT416((uint)in_stack_fffffffffffff68c),
                                       ZEXT416((uint)local_564));
              local_564 = auVar2._0_4_;
            }
            ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x7023ba);
          }
        }
        local_564 = (local_564 / ((float)(local_574 - local_580) * (float)(local_588 - local_584)))
                    * 9.869605;
        local_10c = (local_208 / local_564) * local_10c;
      }
      auVar10 = ZEXT464(0);
      local_738 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10;
      Image::SelectChannels(pIVar18,(ImageChannelDesc *)p_00,AVar19);
      bVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::empty
                        ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                         in_stack_fffffffffffff660);
      pIVar18 = in_stack_fffffffffffff678._8_8_;
      if (bVar3) {
        pIVar16 = (ImageInfiniteLight *)&stack0xfffffffffffffff0;
        in_stack_fffffffffffff660 =
             pstd::pmr::polymorphic_allocator<std::byte>::
             new_object<pbrt::ImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,pstd::pmr::polymorphic_allocator<std::byte>&>
                       ((polymorphic_allocator<std::byte> *)
                        CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                        (Transform *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                        pIVar18,in_stack_fffffffffffff678._0_8_,
                        (float *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff668,
                        (polymorphic_allocator<std::byte> *)in_stack_fffffffffffff6a0);
        TaggedPointer<pbrt::ImageInfiniteLight>((LightHandle *)in_stack_fffffffffffff650,pIVar16);
        operator=((LightHandle *)in_stack_fffffffffffff650,(LightHandle *)pIVar16);
      }
      else {
        local_740 = local_150;
        local_748._M_current =
             (Point3<float> *)
             std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::begin
                       ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                        in_stack_fffffffffffff648);
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::end
                  ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                   in_stack_fffffffffffff648);
        while( true ) {
          auVar12 = auVar10._8_56_;
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                              *)in_stack_fffffffffffff650,
                             (__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                              *)in_stack_fffffffffffff648);
          pIVar18 = in_stack_fffffffffffff678._8_8_;
          if (!bVar3) break;
          pPVar6 = __gnu_cxx::
                   __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                   ::operator*(&local_748);
          PVar14 = CameraTransform::RenderFromWorld
                             ((CameraTransform *)
                              CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                              (Point3f *)in_stack_fffffffffffff668);
          in_stack_fffffffffffff674 = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
          auVar10._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar10._8_56_ = auVar12;
          in_stack_fffffffffffff678 = auVar10._0_16_;
          auVar10 = ZEXT464((uint)in_stack_fffffffffffff674);
          uVar11 = vmovlpd_avx(in_stack_fffffffffffff678);
          (pPVar6->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar11;
          (pPVar6->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar11 >> 0x20);
          (pPVar6->super_Tuple3<pbrt::Point3,_float>).z = in_stack_fffffffffffff674;
          __gnu_cxx::
          __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
          ::operator++(&local_748);
        }
        in_stack_fffffffffffff650 = (ImageAndMetadata *)&stack0xfffffffffffffff0;
        pPVar15 = (PortalImageInfiniteLight *)local_150;
        pstd::pmr::polymorphic_allocator<std::byte>::
        new_object<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                  ((polymorphic_allocator<std::byte> *)
                   CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                   (Transform *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                   pIVar18,in_stack_fffffffffffff678._0_8_,
                   (float *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff668,
                   (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                   in_stack_fffffffffffff6a0,
                   (polymorphic_allocator<std::byte> *)in_stack_fffffffffffff6a8.memoryResource);
        TaggedPointer<pbrt::PortalImageInfiniteLight>
                  ((LightHandle *)in_stack_fffffffffffff650,pPVar15);
        operator=((LightHandle *)in_stack_fffffffffffff650,(LightHandle *)pPVar15);
      }
      Image::~Image(&in_stack_fffffffffffff650->image);
      ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x7026e7);
      ImageAndMetadata::~ImageAndMetadata(in_stack_fffffffffffff650);
    }
    else {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        ErrorExit((FileLoc *)in_stack_fffffffffffff650,(char *)in_stack_fffffffffffff648);
      }
      bVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::empty
                        ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                         in_stack_fffffffffffff660);
      if (!bVar3) {
        ErrorExit((FileLoc *)in_stack_fffffffffffff650,(char *)in_stack_fffffffffffff648);
      }
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::operator[]
                (&local_c8,0);
      SpectrumHandle::SpectrumHandle
                ((SpectrumHandle *)in_stack_fffffffffffff650,
                 (SpectrumHandle *)in_stack_fffffffffffff648);
      FVar7 = SpectrumToPhotometric((SpectrumHandle *)in_stack_fffffffffffff660);
      local_10c = local_10c / FVar7;
      if (0.0 < local_208) {
        local_10c = (local_208 / 3.1415927) * local_10c;
      }
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::operator[]
                (&local_c8,0);
      pstd::pmr::polymorphic_allocator<std::byte>::
      new_object<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                ((polymorphic_allocator<std::byte> *)
                 CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                 in_stack_fffffffffffff668,(SpectrumHandle *)in_stack_fffffffffffff660,
                 (float *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                 (polymorphic_allocator<std::byte> *)in_stack_fffffffffffff650);
      TaggedPointer<pbrt::UniformInfiniteLight>
                ((LightHandle *)in_stack_fffffffffffff650,
                 (UniformInfiniteLight *)in_stack_fffffffffffff648);
      operator=((LightHandle *)in_stack_fffffffffffff650,(LightHandle *)in_stack_fffffffffffff648);
    }
  }
  std::__cxx11::string::~string(local_198);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~vector
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             in_stack_fffffffffffff660);
  std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::~vector
            ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)
             in_stack_fffffffffffff660);
LAB_0070278c:
  bVar3 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI.bits);
  if (bVar3) {
    ParameterDictionary::ReportUnused(in_stack_fffffffffffff820);
    return (LightHandle)
           (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            )in_RDI.bits;
  }
  ErrorExit<std::__cxx11::string_const&>
            ((FileLoc *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
             (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pIVar18);
}

Assistant:

LightHandle LightHandle::Create(const std::string &name,
                                const ParameterDictionary &parameters,
                                const Transform &renderFromLight,
                                const CameraTransform &cameraTransform,
                                MediumHandle outsideMedium, const FileLoc *loc,
                                Allocator alloc) {
    LightHandle light = nullptr;
    if (name == "point")
        light = PointLight::Create(renderFromLight, outsideMedium, parameters,
                                   parameters.ColorSpace(), loc, alloc);
    else if (name == "spot")
        light = SpotLight::Create(renderFromLight, outsideMedium, parameters,
                                  parameters.ColorSpace(), loc, alloc);
    else if (name == "goniometric")
        light = GoniometricLight::Create(renderFromLight, outsideMedium, parameters,
                                         parameters.ColorSpace(), loc, alloc);
    else if (name == "projection")
        light = ProjectionLight::Create(renderFromLight, outsideMedium, parameters, loc,
                                        alloc);
    else if (name == "distant")
        light = DistantLight::Create(renderFromLight, parameters, parameters.ColorSpace(),
                                     loc, alloc);
    else if (name == "infinite") {
        const RGBColorSpace *colorSpace = parameters.ColorSpace();
        std::vector<SpectrumHandle> L =
            parameters.GetSpectrumArray("L", SpectrumType::General, alloc);
        Float scale = parameters.GetOneFloat("scale", 1);
        std::vector<Point3f> portal = parameters.GetPoint3fArray("portal");
        std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
        Float E_v = parameters.GetOneFloat("illuminance", -1);

        if (L.empty() && filename.empty()) {
            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);
            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            // Default: color space's std illuminant
            light = alloc.new_object<UniformInfiniteLight>(
                renderFromLight, &colorSpace->illuminant, scale, alloc);
        } else if (!L.empty()) {
            if (!filename.empty())
                ErrorExit(loc, "Can't specify both emission \"L\" and "
                               "\"filename\" with InfiniteAreaLight");

            if (!portal.empty())
                ErrorExit(loc, "Portals are not supported for InfiniteAreaLights "
                               "without \"filename\".");

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(L[0]);

            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            light = alloc.new_object<UniformInfiniteLight>(renderFromLight, L[0], scale,
                                                           alloc);
        } else {
            ImageAndMetadata imageAndMetadata = Image::Read(filename, alloc);
            const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();

            ImageChannelDesc channelDesc =
                imageAndMetadata.image.GetChannelDesc({"R", "G", "B"});
            if (!channelDesc)
                ErrorExit(loc,
                          "%s: image provided to \"infinite\" light must "
                          "have R, G, and B channels.",
                          filename);

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);

            if (E_v > 0) {
                // Upper hemisphere illuminance calculation for converting map to physical
                // units
                float illuminance = 0;
                const Image &image = imageAndMetadata.image;
                int ye = image.Resolution().y / 2;
                int ys = 0;
                int xs = 0;
                int xe = image.Resolution().x;
                RGB lum = imageAndMetadata.metadata.GetColorSpace()->LuminanceVector();
                for (int y = ys; y < ye; ++y) {
                    float v = (float(y) + 0.5f) / float(image.Resolution().y);
                    float theta = (v - 0.5f) * Pi;
                    float cosTheta = std::cos(theta);
                    float sinTheta = std::sin(theta);
                    for (int x = xs; x < xe; ++x) {
                        ImageChannelValues values = image.GetChannels({x, y});
                        for (int c = 0; c < 3; ++c) {
                            illuminance += values[c] * lum[c] * std::abs(cosTheta) *
                                           std::abs(sinTheta);
                        }
                    }
                }
                illuminance /= float(ye - ys) * float(xe - xs);
                illuminance *= Pi * Pi;

                // scaling factor is just the ratio of the target
                // illuminance and the illuminance of the map multiplied by
                // the illuminant spectrum
                Float k_e = illuminance;
                scale *= E_v / k_e;
            }

            Image image = imageAndMetadata.image.SelectChannels(channelDesc, alloc);

            if (!portal.empty()) {
                for (Point3f &p : portal)
                    p = cameraTransform.RenderFromWorld(p);

                light = alloc.new_object<PortalImageInfiniteLight>(
                    renderFromLight, std::move(image), colorSpace, scale, filename,
                    portal, alloc);
            } else
                light = alloc.new_object<ImageInfiniteLight>(renderFromLight,
                                                             std::move(image), colorSpace,
                                                             scale, filename, alloc);
        }
    } else
        ErrorExit(loc, "%s: light type unknown.", name);

    if (!light)
        ErrorExit(loc, "%s: unable to create light.", name);

    parameters.ReportUnused();
    return light;
}